

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEDate.cpp
# Opt level: O2

double __thiscall CEDate::GetDate(CEDate *this,CEDateType time_format)

{
  invalid_value *this_00;
  double extraout_XMM0_Qa;
  allocator local_5a;
  allocator local_59;
  string local_58;
  string local_38;
  
  if (time_format < (GREGORIAN|MJD)) {
    (*this->_vptr_CEDate[(ulong)time_format + 4])();
    return extraout_XMM0_Qa;
  }
  this_00 = (invalid_value *)__cxa_allocate_exception(0xa8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"CEDate::GetDate()",&local_59);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_58,"Unrecognized time format!",&local_5a);
  CEException::invalid_value::invalid_value(this_00,&local_38,&local_58);
  __cxa_throw(this_00,&CEException::invalid_value::typeinfo,CEExceptionHandler::~CEExceptionHandler)
  ;
}

Assistant:

double CEDate::GetDate(CEDateType time_format) const
{
    // Initialize the return date
    double date(0);

    // Return the julian date if requested
    if (time_format == CEDateType::JD) {
        date = JD() ;
    } else if (time_format == CEDateType::MJD) {
        date = MJD() ;
    } else if (time_format == CEDateType::GREGORIAN) {
        date = Gregorian() ;
    } else {
        throw CEException::invalid_value("CEDate::GetDate()", 
                                         "Unrecognized time format!");
    }

    return date;
}